

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameplayDisplayer.cpp
# Opt level: O0

void __thiscall GameplayDisplayer::drawWorld(GameplayDisplayer *this,World *world)

{
  PrimitiveDisplayer *pPVar1;
  Tetromino *pTVar2;
  QuadHeap *pQVar3;
  GLfloat GVar4;
  Drawable *local_48;
  Drawable *local_28;
  float pps;
  World *world_local;
  GameplayDisplayer *this_local;
  
  GVar4 = PrimitiveDisplayer::getPixelsPerSquare(this->primitiveDisplayer);
  glPushMatrix();
  glTranslatef(GVar4 * 1.0,GVar4 * 1.0,0);
  pPVar1 = this->primitiveDisplayer;
  pTVar2 = World::getActiveTet(world);
  local_28 = (Drawable *)0x0;
  if (pTVar2 != (Tetromino *)0x0) {
    local_28 = &pTVar2->super_Drawable;
  }
  PrimitiveDisplayer::drawableWithGLRotation(pPVar1,local_28);
  pPVar1 = this->primitiveDisplayer;
  pQVar3 = World::getQuadHeap(world);
  local_48 = (Drawable *)0x0;
  if (pQVar3 != (QuadHeap *)0x0) {
    local_48 = &pQVar3->super_Drawable;
  }
  PrimitiveDisplayer::drawableWithGLRotation(pPVar1,local_48);
  glPopMatrix();
  return;
}

Assistant:

void GameplayDisplayer::drawWorld(World* world) {
    float pps = primitiveDisplayer->getPixelsPerSquare();
    glPushMatrix();
        glTranslatef(pps * 1.f, pps * 1.f, 0.f);
        primitiveDisplayer->drawableWithGLRotation(world->getActiveTet());
        primitiveDisplayer->drawableWithGLRotation(world->getQuadHeap());
    glPopMatrix();
    
}